

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O0

void pp_crypto_hash_sha3_process(PHashSHA3 *ctx,puint64 *data)

{
  uint uVar1;
  uint local_1c;
  puint qwords;
  puint i;
  puint64 *data_local;
  PHashSHA3 *ctx_local;
  
  uVar1 = ctx->block_size;
  for (local_1c = 0; local_1c < uVar1 >> 3; local_1c = local_1c + 1) {
    ctx->hash[local_1c] = data[local_1c] ^ ctx->hash[local_1c];
  }
  pp_crypto_hash_sha3_keccak_permutate(ctx);
  return;
}

Assistant:

static void
pp_crypto_hash_sha3_process (PHashSHA3		*ctx,
			     const puint64	*data)
{
	puint i;
	puint qwords = ctx->block_size / 8;

	for (i = 0; i < qwords; ++i)
		ctx->hash[i] ^= data[i];

	/* Make the Keccak permutation */
	pp_crypto_hash_sha3_keccak_permutate (ctx);
}